

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> *
pbrt::ReadFloatFile(vector<float,_std::allocator<float>_> *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  pbrt *this;
  float *ptr;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  vector<float,std::allocator<float>> *pvVar6;
  string_view str;
  int lineNumber;
  int c;
  string ret;
  int va;
  undefined1 local_78 [16];
  pointer local_68;
  char curNumber [32];
  
  __stream = fopen((filename->_M_dataplus)._M_p,"r");
  if (__stream == (FILE *)0x0) {
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string_const&>
              (&ret,"%s: unable to open file",filename);
    Error((FileLoc *)0x0,ret._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p != &ret.field_2) {
      operator_delete(ret._M_dataplus._M_p,
                      CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0])
                      + 1);
    }
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    lineNumber = 1;
    local_78 = ZEXT816(0) << 0x40;
    local_68 = (pointer)0x0;
    bVar5 = false;
    uVar4 = 0;
LAB_00456c62:
    do {
      while( true ) {
        uVar3 = uVar4;
        c = getc(__stream);
        if (c == 10) {
          lineNumber = lineNumber + 1;
        }
        else if (c == -1) {
          fclose(__stream);
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_68;
          pvVar6 = (vector<float,std::allocator<float>> *)local_78;
          goto LAB_00456e5f;
        }
        if (!bVar5) break;
        if (0x1f < (int)uVar3) {
          LogFatal<std::__cxx11::string_const&,int&>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/file.cpp"
                     ,0x80,"Overflowed buffer for parsing number in file: %s at line %d",filename,
                     &lineNumber);
        }
        if ((c - 0x30U < 10) ||
           ((ptr = (float *)(ulong)(c - 0x2bU), c - 0x2bU < 0x3b &&
            ((0x40000000400000dU >> ((ulong)ptr & 0x3f) & 1) != 0)))) {
          ret._M_dataplus._M_p = (pointer)0x20;
          va = uVar3;
          if (0x1f < uVar3) {
            LogFatal<char_const(&)[13],char_const(&)[18],char_const(&)[13],int&,char_const(&)[18],unsigned_long&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/file.cpp"
                       ,0x85,"Check failed: %s < %s with %s = %s, %s = %s",
                       (char (*) [13])"curNumberPos",(char (*) [18])"sizeof(curNumber)",
                       (char (*) [13])"curNumberPos",&va,(char (*) [18])"sizeof(curNumber)",
                       (unsigned_long *)&ret);
          }
          curNumber[uVar3] = (char)c;
          uVar4 = uVar3 + 1;
        }
        else {
          curNumber[(int)uVar3] = '\0';
          this = (pbrt *)strlen(curNumber);
          str._M_str = (char *)&ret;
          str._M_len = (size_t)curNumber;
          bVar1 = Atof(this,str,ptr);
          if (!bVar1) {
            ErrorExit<std::__cxx11::string_const&,char(&)[32]>
                      ("%s: unable to parse float value \"%s\"",filename,&curNumber);
          }
          if ((pointer)local_78._8_8_ == local_68) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)local_78,(iterator)local_78._8_8_,
                       (float *)&ret);
          }
          else {
            *(float *)local_78._8_8_ = ret._M_dataplus._M_p._0_4_;
            local_78._8_8_ = (float *)(local_78._8_8_ + 4);
          }
          uVar4 = 0;
LAB_00456cd4:
          bVar5 = (bool)(bVar5 ^ 1);
        }
      }
      if (c - 0x30U < 10) {
LAB_00456ccb:
        uVar4 = uVar3 + 1;
        curNumber[(int)uVar3] = (char)c;
        goto LAB_00456cd4;
      }
      uVar4 = uVar3;
      if (c == 0x23) {
        do {
          c = getc(__stream);
          if (c == 10) break;
        } while (c != -1);
        lineNumber = lineNumber + 1;
        goto LAB_00456c62;
      }
      if ((c - 0x2dU < 2) || (c == 0x2b)) goto LAB_00456ccb;
      iVar2 = isspace(c);
    } while (iVar2 != 0);
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string_const&,int&,int&>
              (&ret,"%s: unexpected character \"%c\" found at line %d.",filename,&c,&lineNumber);
    Error((FileLoc *)0x0,ret._M_dataplus._M_p);
    pvVar6 = (vector<float,std::allocator<float>> *)__return_storage_ptr__;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p != &ret.field_2) {
      operator_delete(ret._M_dataplus._M_p,
                      CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0])
                      + 1);
    }
LAB_00456e5f:
    *(undefined8 *)pvVar6 = 0;
    *(undefined8 *)(pvVar6 + 8) = 0;
    *(undefined8 *)(pvVar6 + 0x10) = 0;
    if ((void *)local_78._0_8_ != (void *)0x0) {
      operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> ReadFloatFile(const std::string &filename) {
    FILE *f = fopen(filename.c_str(), "r");
    if (f == nullptr) {
        Error("%s: unable to open file", filename);
        return {};
    }

    int c;
    bool inNumber = false;
    char curNumber[32];
    int curNumberPos = 0;
    int lineNumber = 1;
    std::vector<float> values;
    while ((c = getc(f)) != EOF) {
        if (c == '\n')
            ++lineNumber;
        if (inNumber) {
            if (curNumberPos >= (int)sizeof(curNumber))
                LOG_FATAL("Overflowed buffer for parsing number in file: %s at "
                          "line %d",
                          filename, lineNumber);
            // Note: this is not very robust, and would accept something
            // like 0.0.0.0eeee-+--2 as a valid number.
            if ((isdigit(c) != 0) || c == '.' || c == 'e' || c == 'E' || c == '-' ||
                c == '+') {
                CHECK_LT(curNumberPos, sizeof(curNumber));
                curNumber[curNumberPos++] = c;
            } else {
                curNumber[curNumberPos++] = '\0';
                float v;
                if (!Atof(curNumber, &v))
                    ErrorExit("%s: unable to parse float value \"%s\"", filename,
                              curNumber);
                values.push_back(v);
                inNumber = false;
                curNumberPos = 0;
            }
        } else {
            if ((isdigit(c) != 0) || c == '.' || c == '-' || c == '+') {
                inNumber = true;
                curNumber[curNumberPos++] = c;
            } else if (c == '#') {
                while ((c = getc(f)) != '\n' && c != EOF)
                    ;
                ++lineNumber;
            } else if (isspace(c) == 0) {
                Error("%s: unexpected character \"%c\" found at line %d.", filename, c,
                      lineNumber);
                return {};
            }
        }
    }
    fclose(f);
    return values;
}